

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportModuleFunctions(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  long *plVar1;
  SmallArray<FunctionData_*,_128U> *this;
  ModuleData **ppMVar2;
  uchar uVar3;
  uchar uVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  ByteCode *code;
  FunctionData *function;
  ModuleData *pMVar8;
  Lexeme *pLVar9;
  ArgumentData *pAVar10;
  IntrusiveList<MatchData> generics_00;
  IntrusiveList<TypeHandle> arguments;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint offset;
  char *pcVar17;
  ExternVarInfo *pEVar18;
  ExternFuncInfo *pEVar19;
  ExternLocalInfo *pEVar20;
  ulong uVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar22;
  size_t sVar23;
  TypeFunction *pTVar24;
  SynIdentifier *pSVar25;
  TypeBase *pTVar26;
  MatchData *node;
  TypeRef *pTVar27;
  SynBase *this_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  FunctionData *pFVar28;
  TypeFunction *type;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TypeHandle *node_00;
  TypeBase *pTVar29;
  ModuleData **ppMVar30;
  char *pcVar31;
  NamespaceData *nameSpace;
  uint *puVar32;
  long lVar33;
  ulong uVar34;
  char *pcVar35;
  long lVar36;
  ExternFuncInfo *pEVar37;
  Node *pNVar38;
  TypeBase *local_140;
  FunctionLookupChain chain;
  InplaceStr functionName;
  ulong local_b0;
  IntrusiveList<MatchData> generics;
  FunctionLookupChain local_78;
  InplaceStr local_60;
  InplaceStr defaultAssignName;
  TraceScope traceScope;
  ExprBase *context;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_07;
  undefined4 extraout_var_14;
  
  if ((ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar14 = __cxa_guard_acquire(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)
                                    ::token), iVar14 != 0)) {
    ImportModuleFunctions::token = NULLC::TraceGetToken("analyze","ImportModuleFunctions");
    __cxa_guard_release(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleFunctions::token);
  code = moduleCtx->data->bytecode;
  pcVar17 = FindSymbols(code);
  pEVar18 = FindFirstVar(code);
  ppMVar2 = &moduleCtx->data;
  uVar13 = code->variableCount;
  (*ppMVar2)->importedFunctionCount = code->moduleFunctionCount;
  pEVar19 = FindFirstFunc(code);
  pEVar20 = FindFirstLocal(code);
  this = &ctx->functions;
  uVar7 = (ctx->functions).count;
  defaultAssignName.begin = "default_assign$_";
  defaultAssignName.end = "";
  if (code->functionCount != code->moduleFunctionCount) {
    pEVar18 = pEVar18 + uVar13;
    uVar34 = 0;
    do {
      pcVar31 = pcVar17 + pEVar19[uVar34].offsetToName;
      functionName.begin = pcVar31;
      sVar23 = strlen(pcVar31);
      functionName.end = pcVar31 + sVar23;
      pTVar24 = (TypeFunction *)
                GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar19[uVar34].funcType);
      pEVar37 = pEVar19 + uVar34;
      if (pTVar24 == (TypeFunction *)0x0) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: can\'t find function \'%s\' type in module %.*s",
                   pcVar17 + pEVar37->offsetToName,
                   (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)((*ppMVar2)->name).begin));
      }
      generics.head = (MatchData *)0x0;
      generics.tail = (MatchData *)0x0;
      local_b0 = (ulong)pEVar37->explicitTypeCount;
      if (pEVar37->explicitTypeCount == 0) {
        bVar12 = false;
      }
      else {
        puVar32 = &pEVar18->type;
        uVar21 = 0;
        bVar12 = false;
        do {
          pcVar31 = pcVar17 + ((ExternVarInfo *)(puVar32 + -2))->offsetToName;
          sVar23 = strlen(pcVar31);
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar14);
          (pSVar25->super_SynBase).typeID = 4;
          (pSVar25->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar25->super_SynBase).end = (Lexeme *)0x0;
          (pSVar25->super_SynBase).pos.begin = (char *)0x0;
          (pSVar25->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).next + 2) = 0;
          (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
          (pSVar25->name).begin = pcVar31;
          (pSVar25->name).end = pcVar31 + sVar23;
          if (*puVar32 == 0xffffffff) {
            pTVar26 = ctx->typeGeneric;
          }
          else {
            pTVar26 = GetImportedModuleTypeAt(ctx,source,moduleCtx,*puVar32);
          }
          if (pTVar26 == (TypeBase *)0x0) {
            pcVar31 = ((*ppMVar2)->name).begin;
            anon_unknown.dwarf_9fd58::Stop
                      (ctx,source,
                       "ERROR: can\'t find function \'%s\' explicit type \'%d\' in module %.*s",
                       pcVar17 + pEVar37->offsetToName,uVar21 & 0xffffffff,
                       (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)pcVar31),pcVar31);
          }
          bVar11 = pTVar26->isGeneric;
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          node = (MatchData *)CONCAT44(extraout_var_03,iVar14);
          if (bVar11 != false) {
            bVar12 = true;
          }
          node->name = pSVar25;
          node->type = pTVar26;
          node->next = (MatchData *)0x0;
          node->listed = false;
          IntrusiveList<MatchData>::push_back(&generics,node);
          uVar21 = uVar21 + 1;
          local_b0 = (ulong)pEVar37->explicitTypeCount;
          puVar32 = puVar32 + 4;
        } while (uVar21 < local_b0);
      }
      anon_unknown.dwarf_9fd58::LookupFunctionChainByName(&chain,ctx,pEVar37->nameHash);
      lVar36 = 0;
      pNVar38 = (Node *)CONCAT44(chain.node.node._4_4_,chain.node.node._0_4_);
      while (pNVar38 != (Node *)0x0) {
        lVar33 = *(long *)(pNVar38 + 0x10);
        if ((*(char *)(lVar33 + 0x148) == '\0') &&
           (plVar1 = (long *)(lVar33 + 0x28), lVar33 = lVar36, (TypeFunction *)*plVar1 == pTVar24))
        {
          if (pEVar37->explicitTypeCount == 0) {
            pFVar28 = *(FunctionData **)(pNVar38 + 0x10);
            goto LAB_00176f32;
          }
          uVar13 = 0;
          do {
            IntrusiveList<MatchData>::operator[]
                      ((IntrusiveList<MatchData> *)(*(long *)(pNVar38 + 0x10) + 0x48),uVar13);
            IntrusiveList<MatchData>::operator[](&generics,uVar13);
            uVar13 = uVar13 + 1;
          } while (uVar13 < pEVar37->explicitTypeCount);
        }
        anon_unknown.dwarf_9fd58::FunctionLookupChain::next(&local_78,&chain);
        chain.node.start._0_4_ = local_78.node.start._0_4_;
        chain.node.start._4_4_ = local_78.node.start._4_4_;
        chain.node.node._0_4_ = local_78.node.node._0_4_;
        chain.node.node._4_4_ = local_78.node.node._4_4_;
        lVar36 = lVar33;
        pNVar38 = local_78.node.node;
      }
      pFVar28 = (FunctionData *)0x0;
LAB_00176f32:
      if (pFVar28 == (FunctionData *)0x0) {
        uVar13 = (ctx->namespaces).count;
        if (uVar13 != 0) {
          lVar33 = 0;
          do {
            nameSpace = (ctx->namespaces).data[lVar33];
            if (nameSpace->fullNameHash == pEVar37->namespaceHash) goto LAB_00176fef;
            lVar33 = lVar33 + 1;
          } while (uVar13 != (uint)lVar33);
        }
        nameSpace = (NamespaceData *)0x0;
LAB_00176fef:
        if (nameSpace != (NamespaceData *)0x0) {
          ExpressionContext::PushScope(ctx,nameSpace);
        }
        if (pEVar37->parentType == 0xffffffff) {
          local_140 = (TypeBase *)0x0;
        }
        else {
          local_140 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar37->parentType);
          if (local_140 == (TypeBase *)0x0) {
            anon_unknown.dwarf_9fd58::Stop
                      (ctx,source,"ERROR: can\'t find function \'%s\' parent type in module %.*s",
                       pcVar17 + pEVar37->offsetToName,
                       (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)((*ppMVar2)->name).begin
                                    ));
          }
        }
        if (pEVar37->contextType == 0xffffffff) {
          pTVar27 = (TypeRef *)0x0;
        }
        else {
          pTVar27 = (TypeRef *)GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar37->contextType);
          if (pTVar27 == (TypeRef *)0x0) {
            anon_unknown.dwarf_9fd58::Stop
                      (ctx,source,"ERROR: can\'t find function \'%s\' context type in module %.*s",
                       pcVar17 + pEVar37->offsetToName,
                       (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)((*ppMVar2)->name).begin
                                    ));
          }
        }
        if (pTVar27 == (TypeRef *)0x0) {
          pTVar26 = local_140;
          if (local_140 == (TypeBase *)0x0) {
            pTVar26 = ctx->typeVoid;
          }
          pTVar27 = ExpressionContext::GetReferenceType(ctx,pTVar26);
        }
        uVar3 = pEVar37->funcCat;
        uVar4 = pEVar37->isOperator;
        cVar5 = functionName.end[-1];
        if (local_140 != (TypeBase *)0x0) {
          ExpressionContext::PushScope(ctx,local_140);
        }
        ppMVar30 = ppMVar2;
        if (pEVar37->definitionModule != 0) {
          uVar13 = pEVar37->definitionModule - 1;
          if ((moduleCtx->dependencies).count <= uVar13) {
            pcVar17 = 
            "T &SmallArray<ModuleData *, 32>::operator[](unsigned int) [T = ModuleData *, N = 32]";
            goto LAB_00177b0f;
          }
          ppMVar30 = (moduleCtx->dependencies).data + uVar13;
        }
        pMVar8 = *ppMVar30;
        if (pMVar8->lexStreamSize <= pEVar37->definitionLocationStart) {
          __assert_fail("function.definitionLocationStart < importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x32fe,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        if (pMVar8->lexStreamSize <= pEVar37->definitionLocationEnd) {
          __assert_fail("function.definitionLocationEnd < importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x32ff,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        this_00 = source;
        if (pEVar37->definitionLocationEnd != 0 || pEVar37->definitionLocationStart != 0) {
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          this_00 = (SynBase *)CONCAT44(extraout_var_04,iVar14);
          SynBase::SynBase(this_00,1,pMVar8->lexStream + pEVar37->definitionLocationStart,
                           pMVar8->lexStream + pEVar37->definitionLocationEnd);
          this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_0022a430;
        }
        uVar13 = pEVar37->definitionLocationName;
        if (pMVar8->lexStreamSize <= uVar13) {
          __assert_fail("function.definitionLocationName < importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x3303,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        if ((ulong)uVar13 == 0) {
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_06,iVar14);
          (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282e8;
          (pSVar25->super_SynBase).typeID = 4;
          (pSVar25->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar25->super_SynBase).end = (Lexeme *)0x0;
          (pSVar25->super_SynBase).pos.begin = (char *)0x0;
          (pSVar25->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).next + 2) = 0;
          pcVar35 = functionName.end;
          pcVar31 = functionName.begin;
        }
        else {
          pLVar9 = pMVar8->lexStream;
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pcVar35 = functionName.end;
          pcVar31 = functionName.begin;
          pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar14);
          SynBase::SynBase((SynBase *)pSVar25,4,pLVar9 + uVar13,pLVar9 + uVar13);
        }
        (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
        (pSVar25->name).begin = pcVar31;
        (pSVar25->name).end = pcVar35;
        iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
        pFVar28 = (FunctionData *)CONCAT44(extraout_var_07,iVar14);
        if ((pTVar24 == (TypeFunction *)0x0) ||
           (type = pTVar24, (pTVar24->super_TypeBase).typeID != 0x15)) {
          type = (TypeFunction *)0x0;
        }
        uVar13 = ctx->uniqueFunctionId;
        ctx->uniqueFunctionId = uVar13 + 1;
        generics_00.tail._0_4_ = (int)generics.tail;
        generics_00.head = generics.head;
        generics_00.tail._4_4_ = (int)((ulong)generics.tail >> 0x20);
        FunctionData::FunctionData
                  (pFVar28,ctx->allocator,this_00,ctx->scope,uVar3 == '\x03',cVar5 == '$',
                   uVar4 != '\0',type,&pTVar27->super_TypeBase,pSVar25,generics_00,uVar13);
        pFVar28->importModule = pMVar8;
        pFVar28->isPrototype = SUB41((uint)pEVar37->regVmCodeSize >> 0x1f,0);
        if (lVar36 != 0) {
          *(FunctionData **)(lVar36 + 0x150) = pFVar28;
        }
        pFVar28->isGenericInstance = pEVar37->isGenericInstance != '\0';
        chain.node.start._0_4_ = 0x1e142f;
        chain.node.start._4_4_ = 0;
        chain.node.node._0_4_ = 0x1e1435;
        chain.node.node._4_4_ = 0;
        bVar11 = InplaceStr::operator==(&pFVar28->name->name,(InplaceStr *)&chain);
        if (bVar11) {
LAB_0017738a:
          pFVar28->isInternal = true;
        }
        else {
          local_78.node.start = (Node *)0x1e1436;
          local_78.node.node = (Node *)0x1e143c;
          bVar11 = InplaceStr::operator==(&pFVar28->name->name,(InplaceStr *)&local_78);
          if (bVar11) goto LAB_0017738a;
          local_60.begin = "__closeUpvalue";
          local_60.end = "";
          bVar11 = InplaceStr::operator==(&pFVar28->name->name,&local_60);
          if (bVar11) goto LAB_0017738a;
        }
        if (pEVar37->funcCat == '\x01') {
          pFVar28->isHidden = true;
        }
        pFVar28->attributes = pEVar37->attributes;
        ExpressionContext::AddFunction(ctx,pFVar28);
        ExpressionContext::PushScope(ctx,pFVar28);
        pFVar28->functionScope = ctx->scope;
        if (pEVar37->paramCount != 0) {
          uVar13 = 0;
          do {
            uVar16 = pEVar37->offsetToFirstLocal + uVar13;
            bVar6 = pEVar20[uVar16].paramFlags;
            if (pEVar20[uVar16].type == 0xffffffff) {
              pTVar26 = ctx->typeGeneric;
            }
            else {
              pTVar26 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar20[uVar16].type);
            }
            if (pTVar26 == (TypeBase *)0x0) {
              pcVar31 = ((*ppMVar2)->name).begin;
              anon_unknown.dwarf_9fd58::Stop
                        (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                         (ulong)(uVar13 + 1),pcVar17 + pEVar37->offsetToName,
                         (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)pcVar31),pcVar31);
            }
            pcVar31 = pcVar17 + pEVar20[uVar16].offsetToName;
            sVar23 = strlen(pcVar31);
            iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_08,iVar14);
            (pSVar25->super_SynBase).typeID = 4;
            (pSVar25->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar25->super_SynBase).end = (Lexeme *)0x0;
            (pSVar25->super_SynBase).pos.begin = (char *)0x0;
            (pSVar25->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar25->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar25->super_SynBase).next + 2) = 0;
            (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
            (pSVar25->name).begin = pcVar31;
            (pSVar25->name).end = pcVar31 + sVar23;
            uVar16 = (pFVar28->arguments).count;
            if (uVar16 == (pFVar28->arguments).max) {
              SmallArray<ArgumentData,_4U>::grow(&pFVar28->arguments,uVar16);
            }
            pAVar10 = (pFVar28->arguments).data;
            if (pAVar10 == (ArgumentData *)0x0) {
              pcVar17 = 
              "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]";
              goto LAB_00177b2e;
            }
            uVar16 = (pFVar28->arguments).count;
            (pFVar28->arguments).count = uVar16 + 1;
            pAVar10[uVar16].source = source;
            pAVar10[uVar16].isExplicit = (bool)(bVar6 & 1);
            pAVar10[uVar16].name = pSVar25;
            pAVar10[uVar16].type = pTVar26;
            pAVar10[uVar16].value = (ExprBase *)0x0;
            (&pAVar10[uVar16].value)[1] = (ExprBase *)0x0;
            offset = anon_unknown.dwarf_9fd58::AllocateArgumentInScope(ctx,source,0,pTVar26);
            iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
            uVar16 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar16 + 1;
            VariableData::VariableData
                      ((VariableData *)CONCAT44(extraout_var_09,iVar14),ctx->allocator,source,
                       ctx->scope,0,pTVar26,pSVar25,offset,uVar16);
            ExpressionContext::AddVariable
                      (ctx,(VariableData *)CONCAT44(extraout_var_09,iVar14),true);
            uVar13 = uVar13 + 1;
          } while (uVar13 < pEVar37->paramCount);
        }
        if (pTVar27 == (TypeRef *)0x0) {
          __assert_fail("contextType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x333c,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        if (local_140 == (TypeBase *)0x0) {
          uVar16 = anon_unknown.dwarf_9fd58::AllocateArgumentInScope
                             (ctx,source,0,&pTVar27->super_TypeBase);
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_12,iVar14);
          (pSVar25->super_SynBase).typeID = 4;
          (pSVar25->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar25->super_SynBase).end = (Lexeme *)0x0;
          (pSVar25->super_SynBase).pos.begin = (char *)0x0;
          (pSVar25->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).next + 2) = 0;
          (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
          (pSVar25->name).begin = "$context";
          (pSVar25->name).end = "";
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          uVar13 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar13 + 1;
          VariableData::VariableData
                    ((VariableData *)CONCAT44(extraout_var_13,iVar14),ctx->allocator,source,
                     ctx->scope,0,&pTVar27->super_TypeBase,pSVar25,uVar16,uVar13);
          ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_13,iVar14),false)
          ;
        }
        else {
          pTVar27 = ExpressionContext::GetReferenceType(ctx,local_140);
          uVar16 = anon_unknown.dwarf_9fd58::AllocateArgumentInScope
                             (ctx,source,0,&pTVar27->super_TypeBase);
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar25 = (SynIdentifier *)CONCAT44(extraout_var_10,iVar14);
          (pSVar25->super_SynBase).typeID = 4;
          (pSVar25->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar25->super_SynBase).end = (Lexeme *)0x0;
          (pSVar25->super_SynBase).pos.begin = (char *)0x0;
          (pSVar25->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar25->super_SynBase).next + 2) = 0;
          (pSVar25->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
          (pSVar25->name).begin = "this";
          (pSVar25->name).end = "";
          iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          uVar13 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar13 + 1;
          VariableData::VariableData
                    ((VariableData *)CONCAT44(extraout_var_11,iVar14),ctx->allocator,source,
                     ctx->scope,0,&pTVar27->super_TypeBase,pSVar25,uVar16,uVar13);
          ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_11,iVar14),true);
          if ((local_140->typeID == 0x18) &&
             (pcVar31 = strstr((pFVar28->name->name).begin,"::"), pcVar31 != (char *)0x0)) {
            uVar13 = *(uint *)&local_140[3].name.end;
            if (uVar13 == *(uint *)((long)&local_140[3].name.end + 4)) {
              SmallArray<FunctionData_*,_4U>::grow
                        ((SmallArray<FunctionData_*,_4U> *)&local_140[3].name,uVar13);
            }
            pcVar35 = local_140[3].name.begin;
            if (pcVar35 == (char *)0x0) {
              pcVar17 = 
              "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]"
              ;
LAB_00177b2e:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,pcVar17);
            }
            uVar13 = *(uint *)&local_140[3].name.end;
            *(uint *)&local_140[3].name.end = uVar13 + 1;
            *(FunctionData **)(pcVar35 + (ulong)uVar13 * 8) = pFVar28;
            sVar23 = strlen(pcVar31 + 2);
            uVar13 = NULLC::GetStringHash(pcVar31 + 2,pcVar31 + sVar23 + 2);
            DirectChainedMap<FunctionData_*>::insert
                      ((DirectChainedMap<FunctionData_*> *)&local_140[3].arrayTypes,uVar13,pFVar28);
          }
        }
        pFVar28->argumentsSize = pFVar28->functionScope->dataSize;
        if (((pEVar37->funcType == 0) || (bVar12 || ((pTVar24->super_TypeBase).isGeneric & 1U) != 0)
            ) || ((local_140 != (TypeBase *)0x0 && (local_140->isGeneric == true)))) {
          if (pFVar28->importModule->lexStreamSize <= pEVar37->genericOffsetStart) {
            __assert_fail("function.genericOffsetStart < data->importModule->lexStreamSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x3364,
                          "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                         );
          }
          pFVar28->delayedDefinition =
               pFVar28->importModule->lexStream + pEVar37->genericOffsetStart;
          if (pEVar37->genericReturnType == 0xffffffff) {
            pTVar26 = ctx->typeAuto;
          }
          else {
            pTVar26 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar37->genericReturnType);
          }
          if (pTVar26 == (TypeBase *)0x0) {
            anon_unknown.dwarf_9fd58::Stop
                      (ctx,source,
                       "ERROR: can\'t find generic function \'%s\' return type in module %.*s",
                       pcVar17 + pEVar37->offsetToName,
                       (ulong)(uint)(*(int *)&((*ppMVar2)->name).end - (int)((*ppMVar2)->name).begin
                                    ));
          }
          chain.node.start._0_4_ = 0;
          chain.node.start._4_4_ = 0;
          chain.node.node._0_4_ = 0;
          chain.node.node._4_4_ = 0;
          if (pEVar37->paramCount != 0) {
            uVar13 = 0;
            do {
              uVar16 = pEVar37->offsetToFirstLocal;
              iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
              node_00 = (TypeHandle *)CONCAT44(extraout_var_14,iVar14);
              if (pEVar20[uVar16 + uVar13].type == 0xffffffff) {
                pTVar29 = ctx->typeGeneric;
              }
              else {
                pTVar29 = GetImportedModuleTypeAt
                                    (ctx,source,moduleCtx,pEVar20[uVar16 + uVar13].type);
              }
              node_00->type = pTVar29;
              node_00->next = (TypeHandle *)0x0;
              node_00->listed = false;
              IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&chain,node_00);
              uVar13 = uVar13 + 1;
            } while (uVar13 < pEVar37->paramCount);
          }
          arguments.head._4_4_ = chain.node.start._4_4_;
          arguments.head._0_4_ = chain.node.start._0_4_;
          arguments.tail._0_4_ = chain.node.node._0_4_;
          arguments.tail._4_4_ = chain.node.node._4_4_;
          pTVar24 = ExpressionContext::GetFunctionType(ctx,source,pTVar26,arguments);
          pFVar28->type = pTVar24;
        }
        if (pFVar28->type == (TypeFunction *)0x0) {
          __assert_fail("data->type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x337c,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
        if ((pFVar28->isPrototype != false) || (pFVar28->isHidden == true)) {
          ExpressionContext::HideFunction(ctx,pFVar28);
        }
        if (local_140 != (TypeBase *)0x0) {
          ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
        }
        if (nameSpace != (NamespaceData *)0x0) {
          ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE,true);
        }
        bVar12 = InplaceStr::operator==(&functionName,&defaultAssignName);
        if ((bVar12) && ((pFVar28->arguments).count == 2)) {
          pTVar26 = (pFVar28->arguments).data[1].type;
          if ((pTVar26 == (TypeBase *)0x0) || (pTVar26->typeID != 0x18)) {
            pTVar26 = (TypeBase *)0x0;
          }
          if (pTVar26 != (TypeBase *)0x0) {
            *(FunctionData **)&pTVar26[3].typeID = pFVar28;
          }
        }
      }
      else {
        pcVar31 = (pFVar28->name->name).begin;
        if ((*pcVar31 != '$') && (pFVar28->isGenericInstance != true)) {
          pcVar17 = (pFVar28->type->super_TypeBase).name.begin;
          pcVar35 = ((*ppMVar2)->name).begin;
          anon_unknown.dwarf_9fd58::Stop
                    (ctx,source,
                     "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s",
                     (ulong)(uint)(*(int *)&(pFVar28->name->name).end - (int)pcVar31),pcVar31,
                     (ulong)(uint)(*(int *)&(pFVar28->type->super_TypeBase).name.end - (int)pcVar17)
                     ,pcVar17,*(int *)&((*ppMVar2)->name).end - (int)pcVar35,pcVar35);
        }
        uVar13 = (ctx->functions).count;
        if (uVar13 == (ctx->functions).max) {
          SmallArray<FunctionData_*,_128U>::grow(this,uVar13);
        }
        if (this->data == (FunctionData **)0x0) {
          pcVar17 = 
          "void SmallArray<FunctionData *, 128>::push_back(const T &) [T = FunctionData *, N = 128]"
          ;
          goto LAB_00177b2e;
        }
        uVar13 = (ctx->functions).count;
        (ctx->functions).count = uVar13 + 1;
        this->data[uVar13] = pFVar28;
      }
      pEVar18 = pEVar18 + local_b0;
      uVar34 = uVar34 + 1;
    } while (uVar34 < code->functionCount - code->moduleFunctionCount);
  }
  if (code->functionCount != code->moduleFunctionCount) {
    uVar34 = 0;
    do {
      uVar21 = uVar7 + uVar34;
      if ((ctx->functions).count <= uVar21) {
LAB_00177afa:
        pcVar17 = 
        "T &SmallArray<FunctionData *, 128>::operator[](unsigned int) [T = FunctionData *, N = 128]"
        ;
LAB_00177b0f:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,pcVar17);
      }
      if (pEVar19[uVar34].paramCount != 0) {
        pFVar28 = this->data[uVar21];
        lVar36 = 0x20;
        uVar21 = 0;
        do {
          if (pEVar20[pEVar19[uVar34].offsetToFirstLocal + (int)uVar21].defaultFuncId != 0xffff) {
            uVar13 = (pEVar20[pEVar19[uVar34].offsetToFirstLocal + (int)uVar21].defaultFuncId +
                     uVar7) - code->moduleFunctionCount;
            if ((ctx->functions).count <= uVar13) goto LAB_00177afa;
            function = (ctx->functions).data[uVar13];
            iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pTVar24 = function->type;
            iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
            context = (ExprBase *)CONCAT44(extraout_var_00,iVar15);
            pTVar26 = function->contextType;
            context->typeID = 9;
            context->source = source;
            context->type = pTVar26;
            context->next = (ExprBase *)0x0;
            context->listed = false;
            context->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002295f0;
            ExprFunctionAccess::ExprFunctionAccess
                      ((ExprFunctionAccess *)CONCAT44(extraout_var,iVar14),source,
                       &pTVar24->super_TypeBase,function,context);
            iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            puVar22 = (undefined8 *)CONCAT44(extraout_var_01,iVar15);
            pTVar26 = function->type->returnType;
            *(undefined4 *)(puVar22 + 1) = 0x29;
            puVar22[2] = source;
            puVar22[3] = pTVar26;
            puVar22[4] = 0;
            *(undefined1 *)(puVar22 + 5) = 0;
            *puVar22 = &PTR__ExprBase_00229f28;
            puVar22[6] = (ExprFunctionAccess *)CONCAT44(extraout_var,iVar14);
            puVar22[7] = 0;
            puVar22[8] = 0;
            if ((pFVar28->arguments).count <= uVar21) {
              pcVar17 = 
              "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]";
              goto LAB_00177b0f;
            }
            *(undefined8 **)((long)&((pFVar28->arguments).data)->source + lVar36) = puVar22;
          }
          uVar21 = uVar21 + 1;
          lVar36 = lVar36 + 0x30;
        } while (uVar21 < pEVar19[uVar34].paramCount);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < code->functionCount - code->moduleFunctionCount);
  }
  NULLC::TraceScope::~TraceScope(&traceScope);
  return;
}

Assistant:

void ImportModuleFunctions(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleFunctions");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternVarInfo *explicitTypeInfo = FindFirstVar(bCode) + bCode->variableCount;

	moduleCtx.data->importedFunctionCount = bCode->moduleFunctionCount;

	// Import functions
	ExternFuncInfo *functionList = FindFirstFunc(bCode);
	ExternLocalInfo *localList = FindFirstLocal(bCode);

	unsigned currCount = ctx.functions.size();

	InplaceStr defaultAssignName = InplaceStr("default_assign$_");

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		InplaceStr functionName = InplaceStr(symbols + function.offsetToName);

		TypeBase *functionType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.funcType);

		if(!functionType)
			Stop(ctx, source, "ERROR: can't find function '%s' type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

		// Import function explicit type list
		IntrusiveList<MatchData> generics;

		bool hasGenericExplicitType = false;

		for(unsigned k = 0; k < function.explicitTypeCount; k++)
		{
			InplaceStr name = InplaceStr(symbols + explicitTypeInfo[k].offsetToName);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			TypeBase *type = explicitTypeInfo[k].type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, explicitTypeInfo[k].type);

			if(!type)
				Stop(ctx, source, "ERROR: can't find function '%s' explicit type '%d' in module %.*s", symbols + function.offsetToName, k, FMT_ISTR(moduleCtx.data->name));

			if(type->isGeneric)
				hasGenericExplicitType = true;

			generics.push_back(new (ctx.get<MatchData>()) MatchData(nameIdentifier, type));
		}

		explicitTypeInfo += function.explicitTypeCount;

		FunctionData *prev = NULL;
		FunctionData *prototype = NULL;

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, function.nameHash); chain; chain = chain.next())
		{
			if(chain->isPrototype)
			{
				prototype = *chain;
				continue;
			}

			if(chain->type == functionType)
			{
				bool explicitTypeMatch = true;

				for(unsigned k = 0; k < function.explicitTypeCount; k++)
				{
					TypeBase *prevType = chain->generics[k]->type;
					TypeBase *type = generics[k]->type;

					if(&prevType != &type)
						explicitTypeMatch = false;
				}

				if(explicitTypeMatch)
				{
					prev = *chain;
					break;
				}
			}
		}

		if(prev)
		{
			if(*prev->name->name.begin == '$' || prev->isGenericInstance)
				ctx.functions.push_back(prev);
			else
				Stop(ctx, source, "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s", FMT_ISTR(prev->name->name), FMT_ISTR(prev->type->name), FMT_ISTR(moduleCtx.data->name));

			continue;
		}

		NamespaceData *parentNamespace = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->fullNameHash == function.namespaceHash)
			{
				parentNamespace = ctx.namespaces[k];
				break;
			}
		}

		if(parentNamespace)
			ctx.PushScope(parentNamespace);

		TypeBase *parentType = NULL;

		if(function.parentType != ~0u)
		{
			parentType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.parentType);

			if(!parentType)
				Stop(ctx, source, "ERROR: can't find function '%s' parent type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		TypeBase *contextType = NULL;

		if(function.contextType != ~0u)
		{
			contextType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.contextType);

			if(!contextType)
				Stop(ctx, source, "ERROR: can't find function '%s' context type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		if(!contextType)
			contextType = ctx.GetReferenceType(parentType ? parentType : ctx.typeVoid);

		bool coroutine = function.funcCat == ExternFuncInfo::COROUTINE;
		bool accessor = *(functionName.end - 1) == '$';
		bool isOperator = function.isOperator != 0;

		if(parentType)
			ctx.PushScope(parentType);

		ModuleData *importModule = moduleCtx.data;

		if(function.definitionModule != 0)
			importModule = moduleCtx.dependencies[function.definitionModule - 1];

		assert(function.definitionLocationStart < importModule->lexStreamSize);
		assert(function.definitionLocationEnd < importModule->lexStreamSize);

		SynBase *locationSource = function.definitionLocationStart != 0 || function.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(function.definitionLocationStart + importModule->lexStream, function.definitionLocationEnd + importModule->lexStream) : source;

		assert(function.definitionLocationName < importModule->lexStreamSize);

		Lexeme *locationName = function.definitionLocationName + importModule->lexStream;

		SynIdentifier *identifier = function.definitionLocationName != 0 ? new (ctx.get<SynIdentifier>()) SynIdentifier(locationName, locationName, functionName) : new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *data = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, locationSource, ctx.scope, coroutine, accessor, isOperator, getType<TypeFunction>(functionType), contextType, identifier, generics, ctx.uniqueFunctionId++);

		data->importModule = importModule;

		data->isPrototype = (function.regVmCodeSize & 0x80000000) != 0;

		assert(data->isPrototype == ((function.regVmCodeSize & 0x80000000) != 0));

		if(prototype)
			prototype->implementation = data;

		// TODO: find function proto
		data->isGenericInstance = !!function.isGenericInstance;

		if(data->name->name == InplaceStr("__newS") || data->name->name == InplaceStr("__newA") || data->name->name == InplaceStr("__closeUpvalue"))
			data->isInternal = true;

		if(function.funcCat == ExternFuncInfo::LOCAL)
			data->isHidden = true;

		data->attributes = function.attributes;

		ctx.AddFunction(data);

		ctx.PushScope(data);

		data->functionScope = ctx.scope;

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			bool isExplicit = (argument.paramFlags & ExternLocalInfo::IS_EXPLICIT) != 0;

			TypeBase *argType = argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type);

			if(!argType)
				Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			InplaceStr argName = InplaceStr(symbols + argument.offsetToName);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(argName);

			data->arguments.push_back(ArgumentData(source, isExplicit, argNameIdentifier, argType, NULL));

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, argType);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, argType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);
		}

		assert(contextType);

		if(parentType)
		{
			TypeBase *type = ctx.GetReferenceType(parentType);

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);

			// Register type method
			if(TypeClass *typeClass = getType<TypeClass>(parentType))
			{
				if(const char *pos = strstr(data->name->name.begin, "::"))
				{
					typeClass->methods.push_back(data);
					typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), data);
				}
			}
		}
		else if(contextType)
		{
			unsigned offset = AllocateArgumentInScope(ctx, source, 0, contextType);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$context"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, contextType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, false);
		}

		data->argumentsSize = data->functionScope->dataSize;

		// TODO: explicit flag
		if(function.funcType == 0 || functionType->isGeneric || hasGenericExplicitType || (parentType && parentType->isGeneric))
		{
			assert(function.genericOffsetStart < data->importModule->lexStreamSize);

			data->delayedDefinition = function.genericOffsetStart + data->importModule->lexStream;

			TypeBase *returnType = ctx.typeAuto;

			if(function.genericReturnType != ~0u)
				returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.genericReturnType);

			if(!returnType)
				Stop(ctx, source, "ERROR: can't find generic function '%s' return type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			IntrusiveList<TypeHandle> argTypes;

			for(unsigned n = 0; n < function.paramCount; n++)
			{
				ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

				argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type)));
			}

			data->type = ctx.GetFunctionType(source, returnType, argTypes);
		}

		assert(data->type);

		ctx.PopScope(SCOPE_FUNCTION);

		if(data->isPrototype)
			ctx.HideFunction(data);
		else if(data->isHidden)
			ctx.HideFunction(data);

		if(parentType)
			ctx.PopScope(SCOPE_TYPE);

		if(parentNamespace)
			ctx.PopScope(SCOPE_NAMESPACE);

		if(functionName == defaultAssignName && data->arguments.size() == 2)
		{
			if(TypeClass *typeClass = getType<TypeClass>(data->arguments[1].type))
				typeClass->defaultAssign = data;
		}
	}

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		FunctionData *data = ctx.functions[currCount + i];

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			if(argument.defaultFuncId != 0xffff)
			{
				FunctionData *target = ctx.functions[currCount + argument.defaultFuncId - bCode->moduleFunctionCount];

				ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, target->type, target, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, target->contextType));

				data->arguments[n].value = new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, target->type->returnType, access, IntrusiveList<ExprBase>());
			}
		}
	}
}